

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

int __thiscall Catch::TablePrinter::open(TablePrinter *this,char *__file,int __oflag,...)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  TablePrinter *extraout_RAX;
  ColumnInfo *info;
  iterator __end3;
  iterator __begin3;
  vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  *__range3;
  Spacer spacer;
  Columns headerCols;
  Column *in_stack_ffffffffffffff18;
  Column *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  Column *in_stack_ffffffffffffff30;
  size_t in_stack_ffffffffffffff58;
  Spacer *in_stack_ffffffffffffff60;
  __normal_iterator<Catch::(anonymous_namespace)::ColumnInfo_*,_std::vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>_>
  local_78;
  vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  *local_70;
  Columns *in_stack_ffffffffffffffa8;
  ostream *in_stack_ffffffffffffffb0;
  
  if ((this->m_isOpen & 1U) == 0) {
    this->m_isOpen = true;
    Catch::operator<<();
    clara::TextFlow::Columns::Columns((Columns *)0x18f827);
    clara::TextFlow::Spacer::Spacer(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    local_70 = &this->m_columnInfos;
    local_78._M_current =
         (ColumnInfo *)
         clara::std::
         vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
         ::begin((vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
                  *)in_stack_ffffffffffffff18);
    clara::std::
    vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
    ::end((vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
           *)in_stack_ffffffffffffff18);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<Catch::(anonymous_namespace)::ColumnInfo_*,_std::vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>_>
                          *)in_stack_ffffffffffffff20,
                         (__normal_iterator<Catch::(anonymous_namespace)::ColumnInfo_*,_std::vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>_>
                          *)in_stack_ffffffffffffff18);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<Catch::(anonymous_namespace)::ColumnInfo_*,_std::vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>_>
      ::operator*(&local_78);
      clara::TextFlow::Column::Column(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      clara::TextFlow::Column::width(in_stack_ffffffffffffff20,(size_t)in_stack_ffffffffffffff18);
      clara::TextFlow::Columns::operator+=
                ((Columns *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      clara::TextFlow::Column::~Column((Column *)0x18f8d3);
      clara::TextFlow::Columns::operator+=
                ((Columns *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      __gnu_cxx::
      __normal_iterator<Catch::(anonymous_namespace)::ColumnInfo_*,_std::vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>_>
      ::operator++(&local_78);
    }
    poVar2 = clara::TextFlow::operator<<(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    std::operator<<(poVar2,'\n');
    poVar2 = this->m_os;
    pcVar3 = getLineOfChars<(char)45>();
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::operator<<(poVar2,'\n');
    clara::TextFlow::Spacer::~Spacer((Spacer *)0x18f9ca);
    clara::TextFlow::Columns::~Columns((Columns *)0x18f9d7);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

void open() {
        if (!m_isOpen) {
            m_isOpen = true;
            *this << RowBreak();

			Columns headerCols;
			Spacer spacer(2);
			for (auto const& info : m_columnInfos) {
				headerCols += Column(info.name).width(static_cast<std::size_t>(info.width - 2));
				headerCols += spacer;
			}
			m_os << headerCols << '\n';

            m_os << Catch::getLineOfChars<'-'>() << '\n';
        }
    }